

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::work_thread::details::activity_tracking_impl_t::serve_demands_block
          (activity_tracking_impl_t *this,demand_container_t *demands)

{
  bool bVar1;
  reference this_00;
  type last_duration;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> local_48;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> lock_1;
  time_point activity_finished_at;
  value_type *demand;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> lock;
  time_point activity_started_at;
  demand_container_t *demands_local;
  activity_tracking_impl_t *this_local;
  
  lock._M_device = (mutex_type *)std::chrono::_V2::steady_clock::now();
  std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::lock_guard
            ((lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> *)&demand,&this->m_stats_lock);
  this->m_activity_started_at = (time_point *)&lock;
  (this->m_activity_stats).m_count = (this->m_activity_stats).m_count + 1;
  std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::~lock_guard
            ((lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> *)&demand);
  while( true ) {
    bVar1 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::empty
                      (demands);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::front
                        (demands);
    execution_demand_t::call_handler
              (this_00,(current_thread_id_t)
                       (this->
                       super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                       ).m_thread_id._M_thread);
    lock_1._M_device = (mutex_type *)std::chrono::_V2::steady_clock::now();
    std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::pop_front
              (demands);
    std::__atomic_base<unsigned_long>::operator--
              (&(this->
                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                ).m_demands_count.super___atomic_base<unsigned_long>);
    std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::lock_guard
              (&local_48,&this->m_stats_lock);
    last_duration =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&lock_1,
                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&lock);
    stats::details::update_stats_from_duration(&this->m_activity_stats,(duration)last_duration.__r);
    bVar1 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::empty
                      (demands);
    if (bVar1) {
      this->m_activity_started_at = (time_point *)0x0;
    }
    else {
      lock = lock_1;
      (this->m_activity_stats).m_count = (this->m_activity_stats).m_count + 1;
    }
    std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::~lock_guard(&local_48);
  }
  return;
}

Assistant:

void
	serve_demands_block(
		//! Bunch of demands to be processed.
		demand_container_t & demands )
	{
		auto activity_started_at = so_5::stats::clock_type_t::now();

		{
			std::lock_guard< activity_tracking_traits::lock_t > lock{ m_stats_lock };
			m_activity_started_at = &activity_started_at;
			m_activity_stats.m_count += 1;
		}

		while( !demands.empty() )
		{
			auto & demand = demands.front();

			demand.call_handler( m_thread_id );

			const auto activity_finished_at = so_5::stats::clock_type_t::now();

			demands.pop_front();
			--m_demands_count;

			{
				std::lock_guard< activity_tracking_traits::lock_t > lock{ m_stats_lock };
				so_5::stats::details::update_stats_from_duration(
						m_activity_stats,
						activity_finished_at - activity_started_at );

				if( demands.empty() )
					m_activity_started_at = nullptr;
				else
				{
					activity_started_at = activity_finished_at;
					m_activity_stats.m_count += 1;
				}
			}
		}
	}